

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

void __thiscall DerBase::CheckOutputSize(DerBase *this,size_t cbUsed)

{
  size_t sVar1;
  out_of_range *this_00;
  
  sVar1 = GetSizeBytes(this->cbData);
  if (sVar1 + this->cbData + 1 == cbUsed) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Size mismatch!");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void CheckOutputSize(size_t cbUsed)
    {
        if (1 + GetSizeBytes(cbData) + cbData != cbUsed)
            throw std::out_of_range("Size mismatch!");
    }